

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi_tests.cpp
# Opt level: O2

void __thiscall
test::spi_test::iu_SPITest_x_iutest_x_NonFatalFailure2_Test::
~iu_SPITest_x_iutest_x_NonFatalFailure2_Test(iu_SPITest_x_iutest_x_NonFatalFailure2_Test *this)

{
  SPITest::~SPITest(&this->super_SPITest);
  operator_delete(this,0x150);
  return;
}

Assistant:

IUTEST_F(SPITest, NonFatalFailure2)
{
    #define FLAVOR(n) IUTEST_EXPECT##n
    #define FAILURE_MACRO IUTEST_EXPECT_NONFATAL_FAILURE

#include "spi_tests_decl.cpp"

    #undef FLAVOR
    #undef FAILURE_MACRO
}